

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O0

void __thiscall
depspawn::internal::Workitem::insert_in_worklist(Workitem *this,AbstractRunner *itask)

{
  long lVar1;
  arg_info *paVar2;
  bool bVar3;
  __int_type _Var4;
  __pointer_type pWVar5;
  int iVar6;
  undefined8 *puVar7;
  size_t __size;
  atomic<int> *this_00;
  undefined8 uStack_e0;
  undefined1 *local_d8;
  int local_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  Workitem *local_b0 [2];
  short local_9e;
  int local_9c;
  internal_Status_t tmp_status_1;
  arg_info *paStack_98;
  int i_1;
  _dep *newdep;
  int local_88;
  short sStack_82;
  bool conflict;
  int arg_w_i;
  internal_Status_t tmp_status;
  Workitem *ancestor;
  int nfillwait;
  int nready;
  bool steal_work;
  ulong uStack_68;
  int i;
  unsigned_long __vla_expr0;
  int local_54;
  arg_info *paStack_50;
  int nargs;
  arg_info *arg_w;
  arg_info *arg_p;
  Workitem *p;
  AbstractRunner *itask_local;
  Workitem *this_local;
  char *local_20;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  itask_local = (AbstractRunner *)this;
  p = (Workitem *)itask;
  local_b0[0] = this;
  iVar6 = (int)this->nargs_;
  local_54 = iVar6;
  __vla_expr0 = (unsigned_long)&local_d8;
  lVar1 = -((ulong)(iVar6 + 1) * 8 + 0xf & 0xfffffffffffffff0);
  puVar7 = (undefined8 *)((long)&local_d8 + lVar1);
  local_b0[1] = (Workitem *)puVar7;
  uStack_68 = (ulong)(iVar6 + 1);
  nready = 0;
  for (paStack_50 = this->args; paStack_50 != (arg_info *)0x0; paStack_50 = paStack_50->next) {
    puVar7[nready] = paStack_50;
    nready = nready + 1;
  }
  puVar7[iVar6] = 0;
  nfillwait._3_1_ = 0;
  ancestor._4_4_ = 0;
  ancestor._0_4_ = 0;
  this->task = itask;
  _arg_w_i = this->father;
  *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128d9b;
  pWVar5 = std::atomic<depspawn::internal::Workitem_*>::load
                     (*(atomic<depspawn::internal::Workitem_*> **)((long)&local_c8 + lVar1),
                      *(memory_order *)((long)&uStack_cc + lVar1));
  local_b0[0]->next = pWVar5;
  do {
    *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128dc8;
    bVar3 = std::atomic<depspawn::internal::Workitem_*>::compare_exchange_weak
                      (*(atomic<depspawn::internal::Workitem_*> **)((long)local_b0 + lVar1),
                       *(__pointer_type **)(&stack0xffffffffffffff48 + lVar1),
                       *(__pointer_type *)((long)&local_c0 + lVar1),
                       *(memory_order *)((long)&local_c8 + lVar1 + 4));
  } while (((bVar3 ^ 0xffU) & 1) != 0);
  arg_p = (arg_info *)local_b0[0]->next;
  do {
    if (arg_p == (arg_info *)0x0) {
LAB_0012924d:
      if ((FAST_THRESHOLD < ancestor._4_4_) ||
         ((Nthreads < ancestor._4_4_ && (FAST_THRESHOLD < (int)ancestor)))) {
        nfillwait._3_1_ = 1;
      }
      *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x129282;
      _Var4 = std::__atomic_base::operator_cast_to_int
                        (*(__atomic_base<int> **)((long)&local_c8 + lVar1));
      if (_Var4 == 0) {
        *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x129293;
        post(*(Workitem **)((long)&uStack_e0 + lVar1));
      }
      else {
        local_b0[0]->status = Waiting;
      }
      if ((nfillwait._3_1_ & 1) != 0) {
        *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x1292b4;
        TaskPool::try_run(*(TaskPool **)((long)&local_c0 + lVar1));
      }
      return;
    }
    if ((Workitem *)arg_p != local_b0[0]) {
      if ((Workitem *)arg_p == _arg_w_i) {
        _arg_w_i = *(Workitem **)&arg_p->wr;
        if (*(Workitem **)&arg_p->wr != (Workitem *)0x0) {
          *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128e2b;
          bVar3 = is_contained(*(Workitem **)(&stack0xffffffffffffff48 + lVar1),
                               *(Workitem **)((long)&local_c0 + lVar1));
          if (bVar3) {
            local_b0[0]->optFlags_ = local_b0[0]->optFlags_ | 2;
            goto LAB_0012924d;
          }
        }
      }
      else {
        sStack_82 = (short)arg_p->size;
        if (sStack_82 < 4) {
          local_88 = 0;
          arg_w = (arg_info *)arg_p->array_range;
          paStack_50 = *(arg_info **)local_b0[1];
          while( true ) {
            paVar2 = paStack_50;
            local_b1 = false;
            if (arg_w != (arg_info *)0x0) {
              local_b1 = paStack_50 != (arg_info *)0x0;
            }
            if (local_b1 == false) goto LAB_001291da;
            *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128ebc;
            bVar3 = arg_info::is_array(paVar2);
            if (bVar3) {
              local_b2 = false;
              if (arg_w->addr == paStack_50->addr) {
                *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128ee7;
                local_b2 = arg_info::overlap_array
                                     (*(arg_info **)(&stack0xffffffffffffff48 + lVar1),
                                      *(arg_info **)((long)&local_c0 + lVar1));
              }
              local_b3 = local_b2;
            }
            else {
              if (((arg_w->wr & 1U) != 0) || (local_b4 = false, (paStack_50->wr & 1U) != 0)) {
                *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128f24;
                local_b4 = anon_unknown.dwarf_cd44::overlaps
                                     (*(arg_info **)((long)&local_d0 + lVar1),(arg_info *)*puVar7);
              }
              local_b3 = local_b4;
            }
            newdep._7_1_ = local_b3;
            if (local_b3 != false) break;
            if (arg_w->addr < paStack_50->addr) {
              arg_w = arg_w->next;
            }
            else {
              local_88 = local_88 + 1;
              paStack_50 = *(arg_info **)((long)local_b0[1] + (long)local_88 * 8);
            }
          }
          this_00 = &local_b0[0]->ndependencies;
          __size = 0;
          *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128f63;
          std::__atomic_base<int>::operator++(&this_00->super___atomic_base<int>,0);
          *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x128f6f;
          paStack_98 = (arg_info *)
                       LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::malloc
                                 ((LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *
                                  )_dep::Pool,__size);
          paStack_98->size = 0;
          paStack_98->addr = (value_t)local_b0[0];
          do {
            local_c8 = (char *)((long)&arg_p->size + 4);
            this_local._4_4_ = 2;
            local_c0 = 1;
            LOCK();
            uStack_cc._3_1_ = *local_c8;
            *local_c8 = '\x01';
            UNLOCK();
          } while (uStack_cc._3_1_ != '\0');
          if (arg_p[1].array_range == (array_range_t *)0x0) {
            arg_p[1].next = paStack_98;
            arg_p[1].array_range = (array_range_t *)paStack_98;
          }
          else {
            (arg_p[1].next)->size = (size_t)paStack_98;
            arg_p[1].next = (arg_info *)(arg_p[1].next)->size;
          }
          local_d8 = (undefined1 *)((long)&arg_p->size + 4);
          local_14 = 3;
          local_20 = local_c8;
          ___b = local_d8;
          *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x1290c0;
          local_18 = std::operator&(memory_order_release,__memory_order_mask);
          paVar2 = paStack_50;
          local_d0 = local_14;
          if (local_14 == 3) {
            *local_d8 = 0;
          }
          else if (local_14 == 5) {
            LOCK();
            *local_d8 = 0;
            UNLOCK();
          }
          else {
            *local_d8 = 0;
          }
          if ((arg_w->wr & 1U) != 0) {
            *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x12911a;
            bVar3 = arg_info::is_array(paVar2);
            if (bVar3) {
              *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x12912d;
              bVar3 = arg_info::is_contained_array
                                (*(arg_info **)(&stack0xffffffffffffff48 + lVar1),
                                 *(arg_info **)((long)&local_c0 + lVar1));
              if (bVar3) goto LAB_00129146;
            }
            else {
              *(undefined8 *)((long)&uStack_e0 + lVar1) = 0x129140;
              bVar3 = anon_unknown.dwarf_cd44::contains
                                (*(arg_info **)((long)&local_d0 + lVar1),(arg_info *)*puVar7);
              if (bVar3) {
LAB_00129146:
                iVar6 = local_54 + -1;
                local_54 = iVar6;
                for (local_9c = local_88; local_9c <= iVar6; local_9c = local_9c + 1) {
                  *(undefined8 *)((long)local_b0[1] + (long)local_9c * 8) =
                       *(undefined8 *)((long)local_b0[1] + (long)(local_9c + 1) * 8);
                }
              }
            }
          }
LAB_001291da:
          local_9e = (short)arg_p->size;
          ancestor._0_4_ = (uint)(local_9e < 2) + (int)ancestor;
          if (local_9e == 2) {
            ancestor._4_4_ = ancestor._4_4_ + 1;
          }
          if ((short)arg_p->size == 0) {
            local_b0[0]->optFlags_ = local_b0[0]->optFlags_ | 1;
          }
        }
      }
    }
    arg_p = arg_p->next;
  } while( true );
}

Assistant:

void Workitem::insert_in_worklist(AbstractRunner* itask)
    { Workitem* p;
      arg_info *arg_p, *arg_w;

      //Save original list of arguments
      int nargs = static_cast<int>(nargs_);
      arg_info* argv[nargs+1];
      arg_w = args;
      for (int i = 0; arg_w != nullptr; i++) {
        argv[i] = arg_w;     //printf("Fill %d %lu\n", i, arg_w->addr);
        arg_w = arg_w->next;
      }
      argv[nargs] = nullptr;
      
      DEPSPAWN_PROFILEDEFINITION(unsigned int profile_workitems_in_list_lcl = 0,
                                              profile_workitems_in_list_active_lcl = 0);
      DEPSPAWN_PROFILEDEFINITION(bool profile_early_termination_lcl = false);
      
      DEPSPAWN_PROFILEACTION(profile_jobs++);
      
#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      AbstractBoxedFunction *stolen_abf = nullptr;
      static constexpr int FAST_ARR_SZ  = 16;
      Workitem* fast_arr[FAST_ARR_SZ];
#else
      bool steal_work = false;
#endif
      int nready = 0, nfillwait = 0;
#endif
      
      task = itask;
      
      Workitem* ancestor = father;

      next = worklist.load(std::memory_order_relaxed);
      while(!worklist.compare_exchange_weak(next, this));

      for(p = next; p != nullptr; p = p->next) {

        DEPSPAWN_PROFILEACTION(profile_workitems_in_list_lcl++);
        
        // sometimes p == this, even if it shouldn't
        if(p == this) { // fprintf(stderr, "myself?\n");
          continue; // FIXIT
        }
        if(p == ancestor) {
          ancestor = p->father;
          /// TODO: is_contained should be adapted to use argv
          if ( (ancestor != nullptr) && is_contained(this, ancestor)) {
            DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true);
            optFlags_ |= OptFlags::FatherScape;
            break;
          }
        } else {
          const auto tmp_status = p->status;
          if(tmp_status < Status_t::Done) {
            DEPSPAWN_PROFILEACTION(profile_workitems_in_list_active_lcl++);
            int arg_w_i = 0;
            arg_p = p->args; // preexisting workitem
            arg_w = argv[0]; // New workitem
            while(arg_p && arg_w) {

              const bool conflict = arg_w->is_array()
              ? ( (arg_p->addr == arg_w->addr) && arg_w->overlap_array(arg_p) )
              : ( (arg_p->wr || arg_w->wr) && overlaps(arg_p, arg_w) );
              
              if(conflict) { // Found a dependency
                ndependencies++;
                Workitem::_dep* newdep = Workitem::_dep::Pool.malloc();
                newdep->next = nullptr;
                newdep->w = this;
                
                while (p->deps_mutex_.test_and_set(std::memory_order_acquire))  // acquire lock
                  ; // spin
                
                if(!p->deps)
                  p->deps = p->lastdep = newdep;
                else {
                  p->lastdep->next = newdep;
                  p->lastdep = p->lastdep->next;
                }

                //lock.release();
                p->deps_mutex_.clear(std::memory_order_release);               // release lock
                
                DEPSPAWN_DEBUGACTION(
                                     /* You can be linking to Done's that are waiting for you to Fill-in
                                       but NOT for Deallocatable Workitems */
                                     if(p->status == Status_t::Deallocatable) {
                                       printf("%p -> Deallocatable %p (was %d)", this, p, (int)tmp_status);
                                       assert(false);
                                     }
                                     ); // END DEPSPAWN_DEBUGACTION
                if (arg_p->wr &&
                    (arg_w->is_array() ? arg_w->is_contained_array(arg_p) : contains(arg_p, arg_w))) {
                  nargs--;
                  /*
                  if (!nargs) {
                    DEPSPAWN_PROFILEACTION(profile_early_termination_lcl = true); //not true actually...
                    // The optimal thing would be to just make this goto to leave the main loop and insert
                    // the Workitem waiting. But in tests with repeated spawns this leads to very fast insertion
                    // that slows down the performance. Other advantages of continuing down the list:
                    // - More likely DEPSPAWN_FAST_START is triggered and it uses oldest tasks
                    // - optFlags_ is correctly computed
      
                    //goto OUT_MAIN_insert_in_worklist_LOOP;
      
                      argv[0] = nullptr;
                    //break; //There is another break anyway there down
                  } else {
                   */
                    for (int i = arg_w_i; i <= nargs; i++) {
                      argv[i] = argv[i+1];
                    }
                  /*}*/
                }
                break;
              } else {
                if(arg_p->addr < arg_w->addr) {
                  arg_p = arg_p->next;
                } else {
                  arg_w = argv[++arg_w_i];
                }
              }
            }
            
#ifdef DEPSPAWN_FAST_START
            const auto tmp_status = p->status;
            nfillwait += ( tmp_status < Status_t::Ready );
            if ( tmp_status == Status_t::Ready ) {
#ifdef DEPSPAWN_USE_TBB
              fast_arr[nready & (FAST_ARR_SZ - 1)] = p;
#endif
              nready++;
            }
#endif
            if( p->status == Status_t::Filling ) {
              optFlags_ |=  OptFlags::PendingFills;
            }
          }
        }
      }
      
//OUT_MAIN_insert_in_worklist_LOOP:
      
#ifdef DEPSPAWN_FAST_START
      if ((nready > FAST_THRESHOLD) || ((nready > Nthreads) && (nfillwait > FAST_THRESHOLD))) {
        DEPSPAWN_PROFILEACTION(profile_steal_attempts++);
#ifdef DEPSPAWN_USE_TBB
        nready = (nready - 1) & (FAST_ARR_SZ - 1);
        do {
          p = fast_arr[nready--];
          stolen_abf = p->steal();
        } while ( (stolen_abf == nullptr) && (nready >= 0) );
#else
        steal_work = true;
#endif
      }
#endif

      // This is set after stealing work because this way
      // the fast_arr workitems should not have been deallocated
      //status = (!ndependencies) ? Ready : Waiting;
      if (!ndependencies) {
        post();
      } else {
        status = Status_t::Waiting;
      }

#ifdef DEPSPAWN_FAST_START
#ifdef DEPSPAWN_USE_TBB
      if (stolen_abf != nullptr) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
        stolen_abf->run_in_env(false);
        delete stolen_abf;
      }
#else
      if(steal_work && TP->try_run()) {
        DEPSPAWN_PROFILEACTION(profile_steals++);
      }
#endif
#endif
      
      DEPSPAWN_PROFILEACTION(
                             if(profile_early_termination_lcl) {
                               profile_early_terminations++;
                               profile_workitems_in_list_early_termination += profile_workitems_in_list_lcl;
                               profile_workitems_in_list_active_early_termination += profile_workitems_in_list_active_lcl;
                             }
                             profile_workitems_in_list += profile_workitems_in_list_lcl;
                             profile_workitems_in_list_active += profile_workitems_in_list_active_lcl;
                             );
    }